

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Compaction::IsBaseLevelForKey(Compaction *this,Slice *user_key)

{
  ulong uVar1;
  Comparator *pCVar2;
  InternalKey *pIVar3;
  int iVar4;
  size_type sVar5;
  const_reference ppFVar6;
  InternalKey *in_RSI;
  int *in_RDI;
  FileMetaData *f;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  int lvl;
  Comparator *user_cmp;
  InternalKey *this_00;
  Slice local_58;
  Slice local_48;
  value_type local_38;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_30;
  int local_24;
  Comparator *local_20;
  InternalKey *local_18;
  
  local_18 = in_RSI;
  local_20 = InternalKeyComparator::user_comparator
                       ((InternalKeyComparator *)(**(long **)(in_RDI + 4) + 0x38));
  local_24 = *in_RDI + 2;
  do {
    if (6 < local_24) {
      return true;
    }
    local_30 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               (*(long *)(in_RDI + 4) + 0x20 + (long)local_24 * 0x18);
    while (uVar1 = *(ulong *)(in_RDI + (long)local_24 * 2 + 0x48),
          sVar5 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size(local_30), uVar1 < sVar5) {
      ppFVar6 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[](local_30,*(size_type *)(in_RDI + (long)local_24 * 2 + 0x48));
      pCVar2 = local_20;
      local_38 = *ppFVar6;
      this_00 = local_18;
      local_48 = InternalKey::user_key(local_18);
      iVar4 = (*pCVar2->_vptr_Comparator[2])(pCVar2,this_00,&local_48);
      pIVar3 = local_18;
      pCVar2 = local_20;
      if (iVar4 < 1) {
        local_58 = InternalKey::user_key(this_00);
        iVar4 = (*pCVar2->_vptr_Comparator[2])(pCVar2,pIVar3,&local_58);
        if (-1 < iVar4) {
          return false;
        }
        break;
      }
      *(long *)(in_RDI + (long)local_24 * 2 + 0x48) =
           *(long *)(in_RDI + (long)local_24 * 2 + 0x48) + 1;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

bool Compaction::IsBaseLevelForKey(const Slice& user_key) {
  // Maybe use binary search to find right entry instead of linear search?
  const Comparator* user_cmp = input_version_->vset_->icmp_.user_comparator();
  for (int lvl = level_ + 2; lvl < config::kNumLevels; lvl++) {
    const std::vector<FileMetaData*>& files = input_version_->files_[lvl];
    while (level_ptrs_[lvl] < files.size()) {
      FileMetaData* f = files[level_ptrs_[lvl]];
      if (user_cmp->Compare(user_key, f->largest.user_key()) <= 0) {
        // We've advanced far enough
        if (user_cmp->Compare(user_key, f->smallest.user_key()) >= 0) {
          // Key falls in this file's range, so definitely not base level
          return false;
        }
        break;
      }
      level_ptrs_[lvl]++;
    }
  }
  return true;
}